

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batchnorm_x86_avx2.cpp
# Opt level: O0

int __thiscall
ncnn::BatchNorm_x86_avx2::forward_inplace(BatchNorm_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar5;
  void *pvVar6;
  int *piVar7;
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [24];
  float *pfVar16;
  undefined1 (*pauVar17) [32];
  Mat *in_RSI;
  long *in_RDI;
  undefined1 auVar18 [32];
  __m128 _p_7;
  __m128 _b128;
  __m128 _a128;
  __m256 _p_6;
  __m256 _b256;
  __m256 _a256;
  int i_6;
  float b;
  float a;
  float *ptr_6;
  int q_2;
  int size;
  int d;
  int h;
  int w;
  __m128 _p_5;
  int i_5;
  float *ptr_5;
  __m128 _b_5;
  __m128 _a_5;
  int q_1;
  int size_2;
  int c_1;
  int d_2;
  int h_4;
  int w_6;
  __m128 _p_4;
  int j_1;
  float *ptr_4;
  __m128 _b_4;
  __m128 _a_4;
  int i_4;
  int h_3;
  int w_5;
  __m128 _p_3;
  __m128 _b_3;
  __m128 _a_3;
  float *ptr_3;
  int i_3;
  int w_4;
  __m256 _p_2;
  int i_2;
  float *ptr_2;
  __m256 _b_2;
  __m256 _a_2;
  int q;
  int size_1;
  int c;
  int d_1;
  int h_2;
  int w_3;
  __m256 _p_1;
  int j;
  float *ptr_1;
  __m256 _b_1;
  __m256 _a_1;
  int i_1;
  int h_1;
  int w_2;
  __m256 _p;
  __m256 _b;
  __m256 _a;
  float *ptr;
  int i;
  int w_1;
  int elempack;
  int dims;
  undefined8 in_stack_fffffffffffff448;
  Mat *this_00;
  Mat *in_stack_fffffffffffff450;
  undefined8 local_b90;
  undefined8 uStack_b88;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  Option *in_stack_fffffffffffff4e8;
  Mat *in_stack_fffffffffffff4f0;
  BatchNorm *in_stack_fffffffffffff4f8;
  int local_af4;
  Mat local_ae8;
  undefined1 (*local_aa0) [32];
  int local_a94;
  int local_a90;
  int local_a8c;
  int local_a88;
  int local_a84;
  undefined8 local_a80;
  undefined8 uStack_a78;
  int local_a64;
  Mat local_a60;
  Mat *local_a18;
  undefined8 local_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  int local_9e8;
  int local_9e4;
  int local_9e0;
  int local_9dc;
  int local_9d8;
  int local_9d4;
  undefined8 local_9d0;
  undefined8 uStack_9c8;
  int local_9bc;
  float *local_9b8;
  undefined8 local_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  int local_98c;
  int local_988;
  int local_984;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 local_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  float *local_950;
  int local_948;
  int local_944;
  undefined1 local_940 [32];
  int local_920;
  Mat local_910;
  undefined1 (*local_8c8) [32];
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  int local_878;
  int local_874;
  int local_870;
  int local_86c;
  int local_868;
  int local_864;
  undefined1 local_860 [32];
  int local_82c;
  undefined1 (*local_828) [32];
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  int local_7cc;
  int local_7c8;
  int local_7c4;
  undefined1 local_7c0 [32];
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  undefined8 local_780;
  undefined8 uStack_778;
  undefined8 uStack_770;
  undefined8 uStack_768;
  undefined1 (*local_748) [32];
  int local_740;
  int local_73c;
  int local_738;
  int local_734;
  Mat *local_728;
  int local_714;
  undefined1 (*local_710) [32];
  undefined1 (*local_708) [32];
  float *local_700;
  float *local_6f8;
  undefined1 (*local_6f0) [32];
  float *local_6e8;
  float *local_6e0;
  undefined1 (*local_6d8) [32];
  undefined1 (*local_6d0) [32];
  float *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 uStack_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined1 (*local_508) [32];
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined1 (*local_4c8) [32];
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined1 (*local_488) [32];
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  undefined1 (*local_458) [32];
  undefined1 (*local_450) [32];
  Mat *local_448;
  float *local_440;
  float *local_438;
  float *local_430;
  float *local_428;
  float *local_420;
  float *local_418;
  float *local_410;
  float *local_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  undefined8 local_3b0;
  undefined8 uStack_3a8;
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 local_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined1 (*local_2e8) [32];
  void *local_2e0;
  int *piStack_2d8;
  Mat *local_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float *local_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  float *local_290;
  float local_288;
  float local_284;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 uStack_170;
  undefined8 uStack_168;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 uStack_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 uStack_110;
  undefined8 uStack_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 local_e0;
  undefined8 uStack_d8;
  undefined8 uStack_d0;
  undefined8 uStack_c8;
  undefined1 local_c0 [16];
  undefined1 auStack_b0 [16];
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  float local_88;
  float local_84;
  undefined1 local_80 [32];
  float local_50;
  float local_4c;
  float local_48;
  float local_44;
  float local_40;
  float local_3c;
  float local_38;
  float local_34;
  
  local_734 = in_RSI->dims;
  local_738 = in_RSI->elempack;
  local_728 = in_RSI;
  if (local_738 == 8) {
    local_738 = 8;
    if (local_734 == 1) {
      local_73c = in_RSI->w;
      for (local_740 = 0; local_740 < local_73c; local_740 = local_740 + 1) {
        pfVar16 = ncnn::Mat::operator_cast_to_float_(local_728);
        local_748 = (undefined1 (*) [32])(pfVar16 + (local_740 << 3));
        local_6c8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_6c8 = local_6c8 + (local_740 << 3);
        local_780 = *(undefined8 *)local_6c8;
        uStack_778 = *(undefined8 *)(local_6c8 + 2);
        uStack_770 = *(undefined8 *)(local_6c8 + 4);
        uStack_768 = *(undefined8 *)(local_6c8 + 6);
        pfVar16 = ncnn::Mat::operator_cast_to_float_
                            ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_6d0 = (undefined1 (*) [32])(pfVar16 + (local_740 << 3));
        local_7a0 = *(undefined8 *)*local_6d0;
        uStack_798 = *(undefined8 *)(*local_6d0 + 8);
        uStack_790 = *(undefined8 *)(*local_6d0 + 0x10);
        uStack_788 = *(undefined8 *)(*local_6d0 + 0x18);
        local_6d8 = local_748;
        auVar15 = *(undefined1 (*) [24])*local_748;
        uStack_548 = *(undefined8 *)(*local_748 + 0x18);
        local_7c0._0_8_ = auVar15._0_8_;
        local_560 = local_7c0._0_8_;
        local_7c0._8_8_ = auVar15._8_8_;
        uStack_558 = local_7c0._8_8_;
        local_7c0._16_8_ = auVar15._16_8_;
        uStack_550 = local_7c0._16_8_;
        local_5a0 = local_780;
        uStack_598 = uStack_778;
        uStack_590 = uStack_770;
        uStack_588 = uStack_768;
        local_200 = local_7c0._0_8_;
        uStack_1f8 = local_7c0._8_8_;
        uStack_1f0 = local_7c0._16_8_;
        local_240 = local_780;
        uStack_238 = uStack_778;
        uStack_230 = uStack_770;
        uStack_228 = uStack_768;
        auVar8._8_8_ = uStack_778;
        auVar8._0_8_ = local_780;
        auVar8._16_8_ = uStack_770;
        auVar8._24_8_ = uStack_768;
        auVar3 = vfmadd213ps_fma(*local_6d0,*local_748,auVar8);
        local_458 = local_748;
        local_7c0._0_8_ = auVar3._0_8_;
        local_480 = local_7c0._0_8_;
        local_7c0._8_8_ = auVar3._8_8_;
        uStack_478 = local_7c0._8_8_;
        uStack_470 = 0;
        uStack_468 = 0;
        *(undefined8 *)*local_748 = local_7c0._0_8_;
        *(undefined8 *)(*local_748 + 8) = local_7c0._8_8_;
        *(undefined8 *)(*local_748 + 0x10) = 0;
        *(undefined8 *)(*local_748 + 0x18) = 0;
        local_7c0 = ZEXT1632(auVar3);
        local_580 = local_7a0;
        uStack_578 = uStack_798;
        uStack_570 = uStack_790;
        uStack_568 = uStack_788;
        local_220 = local_7a0;
        uStack_218 = uStack_798;
        uStack_210 = uStack_790;
        uStack_208 = uStack_788;
        uStack_1e8 = uStack_548;
      }
    }
    if (local_734 == 2) {
      local_7c4 = local_728->w;
      local_7c8 = local_728->h;
      for (local_7cc = 0; local_7cc < local_7c8; local_7cc = local_7cc + 1) {
        local_6e0 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_6e0 = local_6e0 + (local_7cc << 3);
        local_800 = *(undefined8 *)local_6e0;
        uStack_7f8 = *(undefined8 *)(local_6e0 + 2);
        uStack_7f0 = *(undefined8 *)(local_6e0 + 4);
        uStack_7e8 = *(undefined8 *)(local_6e0 + 6);
        local_6e8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_6e8 = local_6e8 + (local_7cc << 3);
        local_820 = *(undefined8 *)local_6e8;
        uStack_818 = *(undefined8 *)(local_6e8 + 2);
        uStack_810 = *(undefined8 *)(local_6e8 + 4);
        uStack_808 = *(undefined8 *)(local_6e8 + 6);
        local_828 = (undefined1 (*) [32])ncnn::Mat::row(local_728,local_7cc);
        for (local_82c = 0; local_82c < local_7c4; local_82c = local_82c + 1) {
          local_6f0 = local_828;
          auVar15 = *(undefined1 (*) [24])*local_828;
          uStack_5a8 = *(undefined8 *)(*local_828 + 0x18);
          local_860._0_8_ = auVar15._0_8_;
          local_5c0 = local_860._0_8_;
          local_860._8_8_ = auVar15._8_8_;
          uStack_5b8 = local_860._8_8_;
          local_860._16_8_ = auVar15._16_8_;
          uStack_5b0 = local_860._16_8_;
          local_5e0 = local_820;
          uStack_5d8 = uStack_818;
          uStack_5d0 = uStack_810;
          uStack_5c8 = uStack_808;
          local_600 = local_800;
          uStack_5f8 = uStack_7f8;
          uStack_5f0 = uStack_7f0;
          uStack_5e8 = uStack_7e8;
          local_1a0 = local_860._0_8_;
          uStack_198 = local_860._8_8_;
          uStack_190 = local_860._16_8_;
          local_1c0 = local_820;
          uStack_1b8 = uStack_818;
          uStack_1b0 = uStack_810;
          uStack_1a8 = uStack_808;
          local_1e0 = local_800;
          uStack_1d8 = uStack_7f8;
          uStack_1d0 = uStack_7f0;
          uStack_1c8 = uStack_7e8;
          auVar10._8_8_ = uStack_818;
          auVar10._0_8_ = local_820;
          auVar10._16_8_ = uStack_810;
          auVar10._24_8_ = uStack_808;
          auVar9._8_8_ = uStack_7f8;
          auVar9._0_8_ = local_800;
          auVar9._16_8_ = uStack_7f0;
          auVar9._24_8_ = uStack_7e8;
          auVar3 = vfmadd213ps_fma(auVar10,*local_828,auVar9);
          local_488 = local_828;
          local_860._0_8_ = auVar3._0_8_;
          local_4c0 = local_860._0_8_;
          local_860._8_8_ = auVar3._8_8_;
          uStack_4b8 = local_860._8_8_;
          uStack_4b0 = 0;
          uStack_4a8 = 0;
          *(undefined8 *)*local_828 = local_860._0_8_;
          *(undefined8 *)(*local_828 + 8) = local_860._8_8_;
          *(undefined8 *)(*local_828 + 0x10) = 0;
          *(undefined8 *)(*local_828 + 0x18) = 0;
          local_828 = local_828 + 1;
          local_860 = ZEXT1632(auVar3);
          uStack_188 = uStack_5a8;
        }
      }
    }
    if ((local_734 == 3) || (local_734 == 4)) {
      local_864 = local_728->w;
      local_868 = local_728->h;
      local_86c = local_728->d;
      local_870 = local_728->c;
      local_874 = local_864 * local_868 * local_86c;
      for (local_878 = 0; local_878 < local_870; local_878 = local_878 + 1) {
        local_6f8 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_6f8 = local_6f8 + (local_878 << 3);
        local_8a0 = *(undefined8 *)local_6f8;
        uStack_898 = *(undefined8 *)(local_6f8 + 2);
        uStack_890 = *(undefined8 *)(local_6f8 + 4);
        uStack_888 = *(undefined8 *)(local_6f8 + 6);
        local_700 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_700 = local_700 + (local_878 << 3);
        local_8c0 = *(undefined8 *)local_700;
        uStack_8b8 = *(undefined8 *)(local_700 + 2);
        uStack_8b0 = *(undefined8 *)(local_700 + 4);
        uStack_8a8 = *(undefined8 *)(local_700 + 6);
        ncnn::Mat::channel(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20)
                          );
        pauVar17 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_910);
        ncnn::Mat::~Mat((Mat *)0x1909f1);
        local_8c8 = pauVar17;
        for (local_920 = 0; local_920 < local_874; local_920 = local_920 + 1) {
          local_708 = local_8c8;
          auVar15 = *(undefined1 (*) [24])*local_8c8;
          uStack_608 = *(undefined8 *)(*local_8c8 + 0x18);
          local_940._0_8_ = auVar15._0_8_;
          local_620 = local_940._0_8_;
          local_940._8_8_ = auVar15._8_8_;
          uStack_618 = local_940._8_8_;
          local_940._16_8_ = auVar15._16_8_;
          uStack_610 = local_940._16_8_;
          local_640 = local_8c0;
          uStack_638 = uStack_8b8;
          uStack_630 = uStack_8b0;
          uStack_628 = uStack_8a8;
          local_660 = local_8a0;
          uStack_658 = uStack_898;
          uStack_650 = uStack_890;
          uStack_648 = uStack_888;
          local_140 = local_940._0_8_;
          uStack_138 = local_940._8_8_;
          uStack_130 = local_940._16_8_;
          local_160 = local_8c0;
          uStack_158 = uStack_8b8;
          uStack_150 = uStack_8b0;
          uStack_148 = uStack_8a8;
          local_180 = local_8a0;
          uStack_178 = uStack_898;
          uStack_170 = uStack_890;
          uStack_168 = uStack_888;
          auVar12._8_8_ = uStack_8b8;
          auVar12._0_8_ = local_8c0;
          auVar12._16_8_ = uStack_8b0;
          auVar12._24_8_ = uStack_8a8;
          auVar11._8_8_ = uStack_898;
          auVar11._0_8_ = local_8a0;
          auVar11._16_8_ = uStack_890;
          auVar11._24_8_ = uStack_888;
          auVar3 = vfmadd213ps_fma(auVar12,*local_8c8,auVar11);
          local_4c8 = local_8c8;
          local_940._0_8_ = auVar3._0_8_;
          local_500 = local_940._0_8_;
          local_940._8_8_ = auVar3._8_8_;
          uStack_4f8 = local_940._8_8_;
          uStack_4f0 = 0;
          uStack_4e8 = 0;
          *(undefined8 *)*local_8c8 = local_940._0_8_;
          *(undefined8 *)(*local_8c8 + 8) = local_940._8_8_;
          *(undefined8 *)(*local_8c8 + 0x10) = 0;
          *(undefined8 *)(*local_8c8 + 0x18) = 0;
          local_8c8 = local_8c8 + 1;
          local_940 = ZEXT1632(auVar3);
          uStack_128 = uStack_608;
        }
      }
    }
    local_714 = 0;
  }
  else if (local_738 == 4) {
    local_738 = 4;
    if (local_734 == 1) {
      local_944 = in_RSI->w;
      for (local_948 = 0; local_948 < local_944; local_948 = local_948 + 1) {
        local_950 = ncnn::Mat::operator_cast_to_float_(local_728);
        local_950 = local_950 + (local_948 << 2);
        local_408 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_408 = local_408 + (local_948 << 2);
        local_960 = *(undefined8 *)local_408;
        uStack_958 = *(undefined8 *)(local_408 + 2);
        local_410 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_410 = local_410 + (local_948 << 2);
        local_970 = *(undefined8 *)local_410;
        uStack_968 = *(undefined8 *)(local_410 + 2);
        local_418 = local_950;
        uVar4 = *(undefined8 *)local_950;
        uVar5 = *(undefined8 *)(local_950 + 2);
        local_390._0_4_ = (float)uVar4;
        local_390._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_388._0_4_ = (float)uVar5;
        uStack_388._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_3a0._0_4_ = (float)local_970;
        local_3a0._4_4_ = (float)((ulong)local_970 >> 0x20);
        uStack_398._0_4_ = (float)uStack_968;
        uStack_398._4_4_ = (float)((ulong)uStack_968 >> 0x20);
        local_980 = CONCAT44(local_390._4_4_ * local_3a0._4_4_,(float)local_390 * (float)local_3a0);
        uStack_978 = CONCAT44(uStack_388._4_4_ * uStack_398._4_4_,
                              (float)uStack_388 * (float)uStack_398);
        local_310 = local_980;
        uStack_308 = uStack_978;
        local_320._0_4_ = (float)local_960;
        local_320._4_4_ = (float)((ulong)local_960 >> 0x20);
        uStack_318._0_4_ = (float)uStack_958;
        uStack_318._4_4_ = (float)((ulong)uStack_958 >> 0x20);
        local_980 = CONCAT44(local_390._4_4_ * local_3a0._4_4_ + local_320._4_4_,
                             (float)local_390 * (float)local_3a0 + (float)local_320);
        uStack_978 = CONCAT44(uStack_388._4_4_ * uStack_398._4_4_ + uStack_318._4_4_,
                              (float)uStack_388 * (float)uStack_398 + (float)uStack_318);
        local_290 = local_950;
        local_2a0 = local_980;
        uStack_298 = uStack_978;
        *(undefined8 *)local_950 = local_980;
        *(undefined8 *)(local_950 + 2) = uStack_978;
        local_3a0 = local_970;
        uStack_398 = uStack_968;
        local_390 = uVar4;
        uStack_388 = uVar5;
        local_320 = local_960;
        uStack_318 = uStack_958;
      }
    }
    if (local_734 == 2) {
      local_984 = local_728->w;
      local_988 = local_728->h;
      for (local_98c = 0; local_98c < local_988; local_98c = local_98c + 1) {
        local_420 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_420 = local_420 + (local_98c << 2);
        local_9a0 = *(undefined8 *)local_420;
        uStack_998 = *(undefined8 *)(local_420 + 2);
        local_428 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_428 = local_428 + (local_98c << 2);
        local_9b0 = *(undefined8 *)local_428;
        uStack_9a8 = *(undefined8 *)(local_428 + 2);
        local_9b8 = ncnn::Mat::row(local_728,local_98c);
        for (local_9bc = 0; local_9bc < local_984; local_9bc = local_9bc + 1) {
          local_430 = local_9b8;
          uVar4 = *(undefined8 *)local_9b8;
          uVar5 = *(undefined8 *)(local_9b8 + 2);
          local_3b0._0_4_ = (float)uVar4;
          local_3b0._4_4_ = (float)((ulong)uVar4 >> 0x20);
          uStack_3a8._0_4_ = (float)uVar5;
          uStack_3a8._4_4_ = (float)((ulong)uVar5 >> 0x20);
          local_3c0._0_4_ = (float)local_9b0;
          local_3c0._4_4_ = (float)((ulong)local_9b0 >> 0x20);
          uStack_3b8._0_4_ = (float)uStack_9a8;
          uStack_3b8._4_4_ = (float)((ulong)uStack_9a8 >> 0x20);
          local_9d0 = CONCAT44(local_3b0._4_4_ * local_3c0._4_4_,(float)local_3b0 * (float)local_3c0
                              );
          uStack_9c8 = CONCAT44(uStack_3a8._4_4_ * uStack_3b8._4_4_,
                                (float)uStack_3a8 * (float)uStack_3b8);
          local_330 = local_9d0;
          uStack_328 = uStack_9c8;
          local_340._0_4_ = (float)local_9a0;
          local_340._4_4_ = (float)((ulong)local_9a0 >> 0x20);
          uStack_338._0_4_ = (float)uStack_998;
          uStack_338._4_4_ = (float)((ulong)uStack_998 >> 0x20);
          local_9d0 = CONCAT44(local_3b0._4_4_ * local_3c0._4_4_ + local_340._4_4_,
                               (float)local_3b0 * (float)local_3c0 + (float)local_340);
          uStack_9c8 = CONCAT44(uStack_3a8._4_4_ * uStack_3b8._4_4_ + uStack_338._4_4_,
                                (float)uStack_3a8 * (float)uStack_3b8 + (float)uStack_338);
          local_2a8 = local_9b8;
          local_2c0 = local_9d0;
          uStack_2b8 = uStack_9c8;
          *(undefined8 *)local_9b8 = local_9d0;
          *(undefined8 *)(local_9b8 + 2) = uStack_9c8;
          local_9b8 = local_9b8 + 4;
          local_3c0 = local_9b0;
          uStack_3b8 = uStack_9a8;
          local_3b0 = uVar4;
          uStack_3a8 = uVar5;
          local_340 = local_9a0;
          uStack_338 = uStack_998;
        }
      }
    }
    if ((local_734 == 3) || (local_734 == 4)) {
      local_9d4 = local_728->w;
      local_9d8 = local_728->h;
      local_9dc = local_728->d;
      local_9e0 = local_728->c;
      local_9e4 = local_9d4 * local_9d8 * local_9dc;
      for (local_9e8 = 0; local_9e8 < local_9e0; local_9e8 = local_9e8 + 1) {
        local_438 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8));
        local_438 = local_438 + (local_9e8 << 2);
        local_a00 = *(undefined8 *)local_438;
        uStack_9f8 = *(undefined8 *)(local_438 + 2);
        local_440 = ncnn::Mat::operator_cast_to_float_
                              ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240));
        local_440 = local_440 + (local_9e8 << 2);
        local_a10 = *(undefined8 *)local_440;
        uStack_a08 = *(undefined8 *)(local_440 + 2);
        this_00 = &local_a60;
        ncnn::Mat::channel(in_stack_fffffffffffff450,(int)((ulong)this_00 >> 0x20));
        in_stack_fffffffffffff450 = (Mat *)ncnn::Mat::operator_cast_to_float_(this_00);
        ncnn::Mat::~Mat((Mat *)0x19112b);
        local_a18 = in_stack_fffffffffffff450;
        for (local_a64 = 0; local_a64 < local_9e4; local_a64 = local_a64 + 1) {
          local_448 = local_a18;
          pvVar6 = local_a18->data;
          piVar7 = local_a18->refcount;
          local_3d0._0_4_ = SUB84(pvVar6,0);
          local_3d0._4_4_ = (float)((ulong)pvVar6 >> 0x20);
          uStack_3c8._0_4_ = SUB84(piVar7,0);
          uStack_3c8._4_4_ = (float)((ulong)piVar7 >> 0x20);
          local_3e0._0_4_ = (float)local_a10;
          local_3e0._4_4_ = (float)((ulong)local_a10 >> 0x20);
          uStack_3d8._0_4_ = (float)uStack_a08;
          uStack_3d8._4_4_ = (float)((ulong)uStack_a08 >> 0x20);
          local_a80 = (void *)CONCAT44(local_3d0._4_4_ * local_3e0._4_4_,
                                       (float)local_3d0 * (float)local_3e0);
          uStack_a78 = (int *)CONCAT44(uStack_3c8._4_4_ * uStack_3d8._4_4_,
                                       (float)uStack_3c8 * (float)uStack_3d8);
          local_350 = local_a80;
          uStack_348 = uStack_a78;
          local_360._0_4_ = (float)local_a00;
          local_360._4_4_ = (float)((ulong)local_a00 >> 0x20);
          uStack_358._0_4_ = (float)uStack_9f8;
          uStack_358._4_4_ = (float)((ulong)uStack_9f8 >> 0x20);
          local_a80 = (void *)CONCAT44(local_3d0._4_4_ * local_3e0._4_4_ + local_360._4_4_,
                                       (float)local_3d0 * (float)local_3e0 + (float)local_360);
          uStack_a78 = (int *)CONCAT44(uStack_3c8._4_4_ * uStack_3d8._4_4_ + uStack_358._4_4_,
                                       (float)uStack_3c8 * (float)uStack_3d8 + (float)uStack_358);
          local_2c8 = local_a18;
          local_2e0 = local_a80;
          piStack_2d8 = uStack_a78;
          local_a18->data = local_a80;
          local_a18->refcount = uStack_a78;
          local_a18 = (Mat *)&local_a18->elemsize;
          local_3e0 = local_a10;
          uStack_3d8 = uStack_a08;
          local_3d0 = pvVar6;
          uStack_3c8 = piVar7;
          local_360 = local_a00;
          uStack_358 = uStack_9f8;
        }
      }
    }
    local_714 = 0;
  }
  else if ((local_734 == 3) || (local_734 == 4)) {
    local_a84 = in_RSI->w;
    local_a88 = in_RSI->h;
    local_a8c = in_RSI->d;
    local_a90 = local_a84 * local_a88 * local_a8c;
    for (local_a94 = 0; local_a94 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
        local_a94 = local_a94 + 1) {
      ncnn::Mat::channel(in_stack_fffffffffffff450,(int)((ulong)in_stack_fffffffffffff448 >> 0x20));
      pauVar17 = (undefined1 (*) [32])ncnn::Mat::operator_cast_to_float_(&local_ae8);
      ncnn::Mat::~Mat((Mat *)0x1913ad);
      local_aa0 = pauVar17;
      pfVar16 = ncnn::Mat::operator[]
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1f8),
                           (long)local_a94);
      fVar1 = *pfVar16;
      pfVar16 = ncnn::Mat::operator[]
                          ((Mat *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x240),
                           (long)local_a94);
      local_288 = *pfVar16;
      local_af4 = 0;
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
      local_c0 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar1),ZEXT416((uint)fVar1),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x20);
      auStack_b0 = vinsertps_avx(auVar3,ZEXT416((uint)fVar1),0x30);
      auVar3 = vinsertps_avx(ZEXT416((uint)local_288),ZEXT416((uint)local_288),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_288),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_288),0x30);
      auVar2 = vinsertps_avx(ZEXT416((uint)local_288),ZEXT416((uint)local_288),0x10);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_288),0x20);
      auVar2 = vinsertps_avx(auVar2,ZEXT416((uint)local_288),0x30);
      auVar18._16_16_ = auVar3;
      auVar18._0_16_ = auVar2;
      local_80._0_8_ = auVar2._0_8_;
      local_80._8_8_ = auVar2._8_8_;
      local_80._16_8_ = auVar3._0_8_;
      local_80._24_8_ = auVar3._8_8_;
      for (; local_af4 + 7 < local_a90; local_af4 = local_af4 + 8) {
        local_710 = local_aa0;
        auVar15 = *(undefined1 (*) [24])*local_aa0;
        uStack_668 = *(undefined8 *)(*local_aa0 + 0x18);
        local_b60 = auVar15._0_8_;
        local_680 = local_b60;
        uStack_b58 = auVar15._8_8_;
        uStack_678 = uStack_b58;
        uStack_b50 = auVar15._16_8_;
        uStack_670 = uStack_b50;
        local_6a0 = local_80._0_8_;
        uStack_698 = local_80._8_8_;
        uStack_690 = local_80._16_8_;
        uStack_688 = local_80._24_8_;
        local_6c0 = local_c0._0_8_;
        uStack_6b8 = local_c0._8_8_;
        uStack_6b0 = auStack_b0._0_8_;
        uStack_6a8 = auStack_b0._8_8_;
        local_e0 = local_b60;
        uStack_d8 = uStack_b58;
        uStack_d0 = uStack_b50;
        local_100 = local_80._0_8_;
        uStack_f8 = local_80._8_8_;
        uStack_f0 = local_80._16_8_;
        uStack_e8 = local_80._24_8_;
        local_120 = local_c0._0_8_;
        uStack_118 = local_c0._8_8_;
        uStack_110 = auStack_b0._0_8_;
        uStack_108 = auStack_b0._8_8_;
        auVar14._16_8_ = local_80._16_8_;
        auVar14._0_16_ = auVar2;
        auVar14._24_8_ = local_80._24_8_;
        auVar13._16_8_ = auStack_b0._0_8_;
        auVar13._0_16_ = local_c0;
        auVar13._24_8_ = auStack_b0._8_8_;
        auVar3 = vfmadd213ps_fma(auVar14,*local_aa0,auVar13);
        local_508 = local_aa0;
        local_b60 = auVar3._0_8_;
        local_540 = local_b60;
        uStack_b58 = auVar3._8_8_;
        uStack_538 = uStack_b58;
        uStack_530 = 0;
        uStack_528 = 0;
        *(undefined8 *)*local_aa0 = local_b60;
        *(undefined8 *)(*local_aa0 + 8) = uStack_b58;
        *(undefined8 *)(*local_aa0 + 0x10) = 0;
        *(undefined8 *)(*local_aa0 + 0x18) = 0;
        local_aa0 = local_aa0 + 1;
        uStack_c8 = uStack_668;
      }
      local_260 = local_c0._0_8_;
      uStack_258 = local_c0._8_8_;
      uStack_250 = auStack_b0._0_8_;
      uStack_248 = auStack_b0._8_8_;
      local_280 = local_80._0_8_;
      uStack_278 = local_80._8_8_;
      uStack_270 = local_80._16_8_;
      uStack_268 = local_80._24_8_;
      for (; local_af4 + 3 < local_a90; local_af4 = local_af4 + 4) {
        local_450 = local_aa0;
        uVar4 = *(undefined8 *)*local_aa0;
        uVar5 = *(undefined8 *)(*local_aa0 + 8);
        local_3f0._0_4_ = (float)uVar4;
        local_3f0._4_4_ = (float)((ulong)uVar4 >> 0x20);
        uStack_3e8._0_4_ = (float)uVar5;
        uStack_3e8._4_4_ = (float)((ulong)uVar5 >> 0x20);
        local_400._0_4_ = auVar2._0_4_;
        local_400._4_4_ = auVar2._4_4_;
        uStack_3f8._0_4_ = auVar2._8_4_;
        uStack_3f8._4_4_ = auVar2._12_4_;
        local_b90 = CONCAT44(local_3f0._4_4_ * local_400._4_4_,(float)local_3f0 * (float)local_400);
        uStack_b88 = CONCAT44(uStack_3e8._4_4_ * uStack_3f8._4_4_,
                              (float)uStack_3e8 * (float)uStack_3f8);
        local_370 = local_b90;
        uStack_368 = uStack_b88;
        local_380._0_4_ = local_c0._0_4_;
        local_380._4_4_ = local_c0._4_4_;
        uStack_378._0_4_ = local_c0._8_4_;
        uStack_378._4_4_ = local_c0._12_4_;
        local_b90 = CONCAT44(local_3f0._4_4_ * local_400._4_4_ + local_380._4_4_,
                             (float)local_3f0 * (float)local_400 + (float)local_380);
        uStack_b88 = CONCAT44(uStack_3e8._4_4_ * uStack_3f8._4_4_ + uStack_378._4_4_,
                              (float)uStack_3e8 * (float)uStack_3f8 + (float)uStack_378);
        local_2e8 = local_aa0;
        local_300 = local_b90;
        uStack_2f8 = uStack_b88;
        *(undefined8 *)*local_aa0 = local_b90;
        *(undefined8 *)(*local_aa0 + 8) = uStack_b88;
        local_aa0 = (undefined1 (*) [32])(*local_aa0 + 0x10);
        local_400 = local_80._0_8_;
        uStack_3f8 = local_80._8_8_;
        local_3f0 = uVar4;
        uStack_3e8 = uVar5;
        local_380 = local_c0._0_8_;
        uStack_378 = local_c0._8_8_;
      }
      for (; local_af4 < local_a90; local_af4 = local_af4 + 1) {
        *(float *)*local_aa0 = local_288 * *(float *)*local_aa0 + fVar1;
        local_aa0 = (undefined1 (*) [32])(*local_aa0 + 4);
      }
      local_284 = fVar1;
      local_a0 = fVar1;
      local_9c = fVar1;
      local_98 = fVar1;
      local_94 = fVar1;
      local_90 = fVar1;
      local_8c = fVar1;
      local_88 = fVar1;
      local_84 = fVar1;
      local_80 = auVar18;
      local_50 = local_288;
      local_4c = local_288;
      local_48 = local_288;
      local_44 = local_288;
      local_40 = local_288;
      local_3c = local_288;
      local_38 = local_288;
      local_34 = local_288;
    }
    local_714 = 0;
  }
  else {
    local_714 = BatchNorm::forward_inplace
                          (in_stack_fffffffffffff4f8,in_stack_fffffffffffff4f0,
                           in_stack_fffffffffffff4e8);
  }
  return local_714;
}

Assistant:

int BatchNorm_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;

    int elempack = bottom_top_blob.elempack;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 8;

                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                __m256 _p = _mm256_loadu_ps(ptr);
                _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                _mm256_storeu_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + i * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + i * 8);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m256 _a = _mm256_loadu_ps((const float*)a_data + q * 8);
                __m256 _b = _mm256_loadu_ps((const float*)b_data + q * 8);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    _p = _mm256_comp_fmadd_ps(_p, _b, _a);
                    _mm256_storeu_ps(ptr, _p);

                    ptr += 8;
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (dims == 1)
        {
            int w = bottom_top_blob.w;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < w; i++)
            {
                float* ptr = (float*)bottom_top_blob + i * 4;

                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                __m128 _p = _mm_load_ps(ptr);
                _p = _mm_mul_ps(_p, _b);
                _p = _mm_add_ps(_p, _a);
                _mm_store_ps(ptr, _p);
            }
        }

        if (dims == 2)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + i * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + i * 4);

                float* ptr = bottom_top_blob.row(i);

                for (int j = 0; j < w; j++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        if (dims == 3 || dims == 4)
        {
            int w = bottom_top_blob.w;
            int h = bottom_top_blob.h;
            int d = bottom_top_blob.d;
            int c = bottom_top_blob.c;
            int size = w * h * d;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < c; q++)
            {
                __m128 _a = _mm_load_ps((const float*)a_data + q * 4);
                __m128 _b = _mm_load_ps((const float*)b_data + q * 4);

                float* ptr = bottom_top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    _p = _mm_mul_ps(_p, _b);
                    _p = _mm_add_ps(_p, _a);
                    _mm_store_ps(ptr, _p);

                    ptr += 4;
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (dims != 3 && dims != 4)
        return BatchNorm::forward_inplace(bottom_top_blob, opt);

    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    // int c = bottom_top_blob.c;
    int size = w * h * d;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        float a = a_data[q];
        float b = b_data[q];

        int i = 0;
#if __SSE2__
#if __AVX__
        __m256 _a256 = _mm256_set1_ps(a);
        __m256 _b256 = _mm256_set1_ps(b);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _p = _mm256_comp_fmadd_ps(_p, _b256, _a256);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
        __m128 _a128 = _mm256_castps256_ps128(_a256);
        __m128 _b128 = _mm256_castps256_ps128(_b256);
#else
        __m128 _a128 = _mm_set1_ps(a);
        __m128 _b128 = _mm_set1_ps(b);
#endif // __AVX__
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _p = _mm_mul_ps(_p, _b128);
            _p = _mm_add_ps(_p, _a128);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *ptr = b * *ptr + a;

            ptr++;
        }
    }

    return 0;
}